

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::Internal_Write3dmTextStyle(ON_BinaryArchive *this,ON_TextStyle *text_style)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  ON_3DM_BIG_CHUNK *pOVar4;
  
  bVar1 = ArchiveContains3dmTable(this,text_style_table);
  bVar2 = true;
  if (bVar1) {
    bVar1 = Internal_Begin3dmTableRecord(this,text_style_table);
    if (bVar1) {
      Internal_Increment3dmTableItemCount(this);
      lVar3 = (long)(this->m_chunk).m_count;
      pOVar4 = (this->m_chunk).m_a + lVar3;
      if ((pOVar4 == (ON_3DM_BIG_CHUNK *)0x28 || lVar3 < 1) || (pOVar4[-1].m_typecode != 0x10000019)
         ) {
        bVar2 = false;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x2963,"",
                   "ON_BinaryArchive::Write3dmTextStyle() must be called in BeginWrite3dmTextStyleTable() block"
                  );
      }
      else {
        bVar2 = BeginWrite3dmBigChunk(this,0x20008074,0);
        if (bVar2) {
          Internal_Write3dmUpdateManifest(this,&text_style->super_ON_ModelComponent);
          bVar1 = WriteObject(this,(ON_Object *)text_style);
          bVar2 = EndWrite3dmChunk(this);
          bVar2 = bVar2 && bVar1;
        }
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::Internal_Write3dmTextStyle(
  const class ON_TextStyle& text_style
  )
{
  if (false == ArchiveContains3dmTable(ON_3dmArchiveTableType::text_style_table))
    return true;

  if ( false == Internal_Begin3dmTableRecord(ON_3dmArchiveTableType::text_style_table) )
   return false;

  Internal_Increment3dmTableItemCount();

  bool rc = false;

  const ON_3DM_BIG_CHUNK* c = m_chunk.Last();
  if ( c && c->m_typecode == TCODE_FONT_TABLE ) 
  {
    rc = BeginWrite3dmChunk( TCODE_FONT_RECORD, 0 );
    if ( rc ) 
    {
      Internal_Write3dmUpdateManifest(text_style);
      rc = WriteObject( text_style );
      if ( !EndWrite3dmChunk() )
        rc = false;
    }
  }
  else 
  {
    ON_ERROR("ON_BinaryArchive::Write3dmTextStyle() must be called in BeginWrite3dmTextStyleTable() block");
    rc = false;
  }

  return rc;
}